

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O3

uint Kit_TruthIsop5_rec(uint uOn,uint uOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  int *piVar1;
  Vec_Int_t *vStore_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uOnDc1;
  uint uOnDc0;
  uint uOn1;
  uint uOn0;
  Kit_Sop_t cRes2;
  Kit_Sop_t cRes1;
  Kit_Sop_t cRes0;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  Vec_Int_t *local_68;
  Kit_Sop_t local_60;
  Kit_Sop_t local_50;
  Kit_Sop_t local_40;
  
  local_70 = uOnDc;
  local_6c = uOn;
  if ((~uOnDc & uOn) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                  ,0x118,
                  "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if (uOn == 0) {
    pcRes->nLits = 0;
    pcRes->nCubes = 0;
    pcRes->pCubes = (uint *)0x0;
  }
  else if (uOnDc == 0xffffffff) {
    pcRes->nLits = 0;
    pcRes->nCubes = 1;
    iVar10 = vStore->nSize;
    vStore->nSize = iVar10 + 1;
    if (iVar10 < vStore->nCap) {
      piVar1 = vStore->pArray;
      pcRes->pCubes = (uint *)(piVar1 + iVar10);
      piVar1[iVar10] = 0;
      return 0xffffffff;
    }
    pcRes->pCubes = (uint *)0x0;
    pcRes->nCubes = -1;
  }
  else {
    local_68 = vStore;
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                    ,0x12d,
                    "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
    iVar10 = nVars * 2;
    do {
      uVar3 = nVars;
      iVar10 = iVar10 + -2;
      if ((int)uVar3 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                      ,0x133,
                      "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                     );
      }
      nVars = uVar3 - 1;
      iVar2 = Kit_TruthVarInSupport(&local_6c,5,nVars);
    } while ((iVar2 == 0) && (iVar2 = Kit_TruthVarInSupport(&local_70,5,nVars), iVar2 == 0));
    local_78 = local_6c;
    local_74 = local_6c;
    local_80 = local_70;
    local_7c = local_70;
    Kit_TruthCofactor0(&local_74,uVar3,nVars);
    Kit_TruthCofactor1(&local_78,uVar3,nVars);
    Kit_TruthCofactor0(&local_7c,uVar3,nVars);
    Kit_TruthCofactor1(&local_80,uVar3,nVars);
    vStore_00 = local_68;
    uVar3 = Kit_TruthIsop5_rec(~local_80 & local_74,local_7c,nVars,&local_40,local_68);
    uVar11 = (ulong)(uint)local_40.nCubes;
    if (uVar11 != 0xffffffff) {
      uVar4 = Kit_TruthIsop5_rec(~local_7c & local_78,local_80,nVars,&local_50,vStore_00);
      if ((ulong)(uint)local_50.nCubes != 0xffffffff) {
        uVar5 = Kit_TruthIsop5_rec(~uVar4 & local_78 | ~uVar3 & local_74,local_80 & local_7c,nVars,
                                   &local_60,vStore_00);
        if ((ulong)(uint)local_60.nCubes != 0xffffffff) {
          pcRes->nLits = local_40.nLits + local_50.nCubes + local_40.nCubes + local_50.nLits +
                         local_60.nLits;
          uVar6 = local_60.nCubes + local_50.nCubes + local_40.nCubes;
          pcRes->nCubes = uVar6;
          if (uVar6 != 0) {
            if ((int)uVar6 < 1) {
              __assert_fail("nWords > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x39a,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
            }
            lVar8 = (long)(int)uVar6 + (long)local_68->nSize;
            local_68->nSize = (int)lVar8;
            if ((int)lVar8 <= local_68->nCap) {
              piVar1 = local_68->pArray;
              uVar9 = (ulong)uVar6;
              pcRes->pCubes = (uint *)(piVar1 + (lVar8 - uVar9));
              if (local_40.nCubes < 1) {
                uVar11 = 0;
              }
              else {
                uVar7 = 0;
                do {
                  (piVar1 + (lVar8 - uVar9))[uVar7] =
                       local_40.pCubes[uVar7] | 1 << ((byte)iVar10 & 0x1f);
                  uVar7 = uVar7 + 1;
                } while (uVar11 != uVar7);
              }
              if (0 < local_50.nCubes) {
                uVar7 = 0;
                do {
                  piVar1[(lVar8 + uVar11 + uVar7) - uVar9] =
                       local_50.pCubes[uVar7] | 2 << ((byte)iVar10 & 0x1f);
                  uVar7 = uVar7 + 1;
                } while ((uint)local_50.nCubes != uVar7);
                uVar11 = (ulong)(uint)((int)uVar11 + (int)uVar7);
              }
              iVar10 = (int)uVar11;
              if (0 < local_60.nCubes) {
                uVar7 = 0;
                do {
                  piVar1[(lVar8 + uVar11 + uVar7) - uVar9] = local_60.pCubes[uVar7];
                  uVar7 = uVar7 + 1;
                } while ((uint)local_60.nCubes != uVar7);
                iVar10 = iVar10 + (int)uVar7;
              }
              if (iVar10 != pcRes->nCubes) {
                __assert_fail("k == pcRes->nCubes",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                              ,0x15e,
                              "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                             );
              }
              return uVar4 & *(uint *)(&DAT_0094fd50 + (ulong)(uint)nVars * 4) | uVar5 |
                     uVar3 & ~*(uint *)(&DAT_0094fd50 + (ulong)(uint)nVars * 4);
            }
          }
          pcRes->pCubes = (uint *)0x0;
          pcRes->nCubes = -1;
          return 0;
        }
      }
    }
    pcRes->nCubes = -1;
  }
  return 0;
}

Assistant:

unsigned Kit_TruthIsop5_rec( unsigned uOn, unsigned uOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int i, k, Var;
    assert( nVars <= 5 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        return 0;
    }
    if ( uOnDc == 0xFFFFFFFF )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return 0;
        }
        pcRes->pCubes[0] = 0;
        return 0xFFFFFFFF;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( &uOn, 5, Var ) || 
             Kit_TruthVarInSupport( &uOnDc, 5, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = uOn1   = uOn;
    uOnDc0 = uOnDc1 = uOnDc;
    Kit_TruthCofactor0( &uOn0, Var + 1, Var );
    Kit_TruthCofactor1( &uOn1, Var + 1, Var );
    Kit_TruthCofactor0( &uOnDc0, Var + 1, Var );
    Kit_TruthCofactor1( &uOnDc1, Var + 1, Var );
    // solve for cofactors
    uRes0 = Kit_TruthIsop5_rec( uOn0 & ~uOnDc1, uOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes1 = Kit_TruthIsop5_rec( uOn1 & ~uOnDc0, uOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes2 = Kit_TruthIsop5_rec( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & ~uMasks[Var]) | (uRes1 & uMasks[Var]);
//    assert( (uOn & ~uRes2) == 0 );
//    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}